

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Renderer.cpp
# Opt level: O0

void __thiscall
solitaire::graphics::Renderer::renderCard(Renderer *this,Position *position,Card *card)

{
  Card *pCVar1;
  pointer pGVar2;
  Area local_34;
  TextureId local_24;
  Card *local_20;
  Card *card_local;
  Position *position_local;
  Renderer *this_local;
  
  local_20 = card;
  card_local = (Card *)position;
  position_local = (Position *)this;
  pGVar2 = std::
           unique_ptr<solitaire::graphics::interfaces::GraphicsSystem,_std::default_delete<solitaire::graphics::interfaces::GraphicsSystem>_>
           ::operator->(&this->graphicsSystem);
  TextureId::TextureId(&local_24,&this->cardsId);
  pCVar1 = card_local;
  local_34 = getCardTextureArea(this,local_20);
  (*pGVar2->_vptr_GraphicsSystem[5])(pGVar2,&local_24,pCVar1,&local_34);
  return;
}

Assistant:

void Renderer::renderCard(const Position& position, const Card& card) const {
    graphicsSystem->renderTexture(
        cardsId, position, getCardTextureArea(card));
}